

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O2

void __thiscall
graphics101::VertexAndFaceArrays::uploadFaces
          (VertexAndFaceArrays *this,
          vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
          *face_indices,GLenum mode)

{
  pointer face_indices_00;
  pointer pvVar1;
  
  face_indices_00 =
       (face_indices->
       super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (face_indices->
           super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (face_indices_00 != pvVar1) {
    uploadFaces(this,(GLint *)face_indices_00,
                (int)(((long)pvVar1 - (long)face_indices_00) / 0xc) * 3,mode);
    return;
  }
  __assert_fail("!face_indices.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                ,0xa6,
                "void graphics101::VertexAndFaceArrays::uploadFaces(const std::vector<ivec3> &, GLenum)"
               );
}

Assistant:

void VertexAndFaceArrays::uploadFaces( const std::vector< ivec3 >& face_indices, GLenum mode ) {
    assert( !face_indices.empty() );
    assert( sizeof( ivec3 ) == 3*sizeof( GLint ) );
    
    uploadFaces( glm::value_ptr( face_indices.front() ), 3*face_indices.size(), mode );
}